

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

char * QtPrivate::QTypeNormalizer::skipTemplate(char *x,char *e,bool stopAtComa)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  byte *pbVar4;
  int iVar5;
  byte *pbVar6;
  bool bVar7;
  
  if (x == e) {
    return x;
  }
  iVar2 = 0;
  iVar5 = 0;
  do {
    bVar1 = *x;
    if (0x3b < bVar1) {
      if (0x5c < bVar1) {
        if (bVar1 != 0x5d) {
          if (bVar1 == 0x7b) goto switchD_00123f3b_caseD_28;
          if (bVar1 != 0x7d) goto switchD_00123f3b_caseD_23;
        }
        goto switchD_00123f3b_caseD_29;
      }
      if (bVar1 == 0x3c) {
        iVar2 = iVar2 + (uint)(iVar5 == 0);
      }
      else if (bVar1 == 0x3e) {
        if (iVar5 == 0) {
          if (iVar2 < 1) {
            return (char *)(byte *)x;
          }
          iVar2 = iVar2 + -1;
          iVar5 = 0;
        }
      }
      else if (bVar1 == 0x5b) goto switchD_00123f3b_caseD_28;
      goto switchD_00123f3b_caseD_23;
    }
    switch(bVar1) {
    case 0x22:
      goto switchD_00123f3b_caseD_22;
    case 0x27:
      if ((byte)(((byte *)x)[-1] - 0x30) < 10) break;
      goto switchD_00123f3b_caseD_22;
    case 0x28:
switchD_00123f3b_caseD_28:
      iVar5 = iVar5 + 1;
      break;
    case 0x29:
switchD_00123f3b_caseD_29:
      iVar5 = iVar5 + -1;
      break;
    case 0x2c:
      if ((iVar5 == 0 && stopAtComa) && (iVar2 == 0)) {
        return (char *)(byte *)x;
      }
    }
switchD_00123f3b_caseD_23:
    x = (char *)((byte *)x + 1);
joined_r0x0012400a:
    if (x == e) {
      return (char *)(byte *)x;
    }
  } while( true );
switchD_00123f3b_caseD_22:
  pbVar6 = (byte *)x + 1;
  bVar7 = pbVar6 == (byte *)e;
  if (!bVar7) {
    bVar3 = *pbVar6;
    pbVar4 = pbVar6;
    while (pbVar6 = pbVar4, bVar3 != bVar1) {
      if ((bVar3 == 0x5c) && (pbVar4 = (byte *)x + 2, x = e, pbVar4 == (byte *)e))
      goto joined_r0x0012400a;
      pbVar6 = pbVar4 + 1;
      bVar7 = pbVar6 == (byte *)e;
      x = (char *)pbVar4;
      if (bVar7) break;
      pbVar4 = pbVar6;
      bVar3 = *pbVar6;
    }
  }
  x = (char *)((byte *)x + 2);
  if (bVar7) {
    x = (char *)pbVar6;
  }
  goto joined_r0x0012400a;
}

Assistant:

static constexpr const char *skipTemplate(const char *x, const char *e, bool stopAtComa = false)
    {
        int scopeDepth = 0;
        int templateDepth = 0;
        while (x != e) {
            switch (*x) {
            case '<':
                if (!scopeDepth)
                    templateDepth++;
                break;
            case ',':
                if (stopAtComa && !scopeDepth && !templateDepth)
                    return x;
                break;
            case '>':
                if (!scopeDepth)
                    if (--templateDepth < 0)
                        return x;
                break;
            case '(':
            case '[':
            case '{':
                scopeDepth++;
                break;
            case '}':
            case ']':
            case ')':
                scopeDepth--;
                break;
            case '\'':
                if (is_number(x[-1]))
                    break;
                Q_FALLTHROUGH();
            case '\"':
                x = skipString(x, e);
                continue;
            }
            x++;
        }
        return x;
    }